

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRestruct.c
# Opt level: O3

void Abc_NodeEdgeDsdPushOrdered(Dec_Graph_t *pGraph,Vec_Int_t *vEdges,int Edge)

{
  int *piVar1;
  Dec_Node_t *pDVar2;
  bool bVar3;
  ulong uVar4;
  
  uVar4 = (ulong)vEdges->nSize;
  vEdges->nSize = vEdges->nSize + 1;
  piVar1 = vEdges->pArray;
  if (0 < (long)uVar4) {
    pDVar2 = pGraph->pNodes;
    do {
      if ((*(uint *)&pDVar2[(uint)Edge >> 1 & 0x3fffffff].field_0x10 & 0x3fff) <
          (*(uint *)&pDVar2[(uint)piVar1[uVar4 - 1] >> 1 & 0x3fffffff].field_0x10 & 0x3fff))
      goto LAB_00294f5a;
      piVar1[uVar4] = piVar1[uVar4 - 1];
      bVar3 = 1 < uVar4;
      uVar4 = uVar4 - 1;
    } while (bVar3);
    uVar4 = 0;
  }
LAB_00294f5a:
  piVar1[(int)uVar4] = Edge;
  return;
}

Assistant:

void Abc_NodeEdgeDsdPushOrdered( Dec_Graph_t * pGraph, Vec_Int_t * vEdges, int Edge )
{
    int i, NodeOld, NodeNew;
    vEdges->nSize++;
    for ( i = vEdges->nSize-2; i >= 0; i-- )
    {
        NodeOld = Dec_IntToEdge(vEdges->pArray[i]).Node;
        NodeNew = Dec_IntToEdge(Edge).Node;
        // use <= because we are trying to push the new (non-existent) nodes as far as possible
        if ( Dec_GraphNode(pGraph, NodeOld)->Level <= Dec_GraphNode(pGraph, NodeNew)->Level )
            vEdges->pArray[i+1] = vEdges->pArray[i];
        else
            break;
    }
    vEdges->pArray[i+1] = Edge;
}